

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vshuff32x4(PDISASM pMyDisasm)

{
  char *pcVar1;
  
  if (((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x01')) {
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
      builtin_strncpy(pcVar1,"vshuff32x4",0xb);
    }
    else {
      builtin_strncpy(pcVar1,"vshuff64x2",0xb);
    }
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    if ((pMyDisasm->Reserved_).VEX.L == '\0') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    ArgsVEX(pMyDisasm);
    getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
    return;
  }
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vshuff32x4(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vshuff32x4");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vshuff64x2");
        #endif
      }
      GV.EVEX.tupletype = FULL;
      if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}